

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

InplaceStr GetModuleName(Allocator *allocator,char *moduleRoot,IntrusiveList<SynIdentifier> parts)

{
  char *__src;
  size_t sVar1;
  SynIdentifier *pSVar2;
  undefined4 extraout_var;
  char *__dest;
  SynIdentifier *pSVar3;
  int iVar4;
  InplaceStr IVar5;
  
  iVar4 = 0;
  pSVar3 = parts.head;
  for (pSVar2 = pSVar3; pSVar2 != (SynIdentifier *)0x0;
      pSVar2 = (SynIdentifier *)(pSVar2->super_SynBase).next) {
    iVar4 = iVar4 + 1;
  }
  if (moduleRoot == (char *)0x0) {
    iVar4 = iVar4 + 2;
  }
  else {
    sVar1 = strlen(moduleRoot);
    iVar4 = iVar4 + (int)sVar1 + 3;
  }
  pSVar2 = pSVar3;
  if (pSVar3 != (SynIdentifier *)0x0) {
    do {
      iVar4 = (*(int *)&(pSVar2->name).end - *(int *)&(pSVar2->name).begin) + iVar4;
      pSVar2 = (SynIdentifier *)(pSVar2->super_SynBase).next;
      if (pSVar2 == (SynIdentifier *)0x0) break;
    } while ((pSVar2->super_SynBase).typeID == 4);
  }
  iVar4 = (*allocator->_vptr_Allocator[2])(allocator,(ulong)(iVar4 + 1));
  IVar5.begin = (char *)CONCAT44(extraout_var,iVar4);
  __dest = IVar5.begin;
  if (moduleRoot != (char *)0x0) {
    strcpy(IVar5.begin,moduleRoot);
    sVar1 = strlen(moduleRoot);
    __dest = IVar5.begin + sVar1 + 1;
    IVar5.begin[sVar1] = '/';
  }
  if (pSVar3 != (SynIdentifier *)0x0) {
    while( true ) {
      __src = (pSVar3->name).begin;
      memcpy(__dest,__src,(ulong)(uint)(*(int *)&(pSVar3->name).end - (int)__src));
      __dest = __dest + (uint)(*(int *)&(pSVar3->name).end - *(int *)&(pSVar3->name).begin);
      if ((pSVar3->super_SynBase).next == (SynBase *)0x0) break;
      *__dest = '/';
      __dest = __dest + 1;
      pSVar3 = (SynIdentifier *)(pSVar3->super_SynBase).next;
      if ((pSVar3 == (SynIdentifier *)0x0) || ((pSVar3->super_SynBase).typeID != 4)) break;
    }
  }
  builtin_strncpy(__dest,".nc",4);
  sVar1 = strlen(IVar5.begin);
  IVar5.end = IVar5.begin + sVar1;
  return IVar5;
}

Assistant:

InplaceStr GetModuleName(Allocator *allocator, const char *moduleRoot, IntrusiveList<SynIdentifier> parts)
{
	unsigned pathLength = unsigned(parts.size() - 1 + strlen(".nc"));

	if(moduleRoot)
		pathLength += unsigned(strlen(moduleRoot)) + 1;

	for(SynIdentifier *part = parts.head; part; part = getType<SynIdentifier>(part->next))
		pathLength += part->name.length();

	char *path = (char*)allocator->alloc(pathLength + 1);

	char *pos = path;

	if(moduleRoot)
	{
		strcpy(pos, moduleRoot);
		pos += strlen(moduleRoot);

		*pos++ = '/';
	}

	for(SynIdentifier *part = parts.head; part; part = getType<SynIdentifier>(part->next))
	{
		memcpy(pos, part->name.begin, part->name.length());
		pos += part->name.length();

		if(part->next)
			*pos++ = '/';
	}

	strcpy(pos, ".nc");
	pos += strlen(".nc");

	*pos = 0;

	return InplaceStr(path);
}